

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ulong uVar16;
  byte bVar17;
  bool bVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  byte bVar22;
  long lVar23;
  byte bVar24;
  undefined1 (*pauVar25) [32];
  NodeRef root;
  long lVar26;
  ulong *puVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar62 [64];
  Precalculations pre;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  uint local_5aac;
  Precalculations local_5aa5;
  undefined4 local_5aa4;
  RayK<8> *local_5aa0;
  ulong local_5a98;
  RayQueryContext *local_5a90;
  size_t local_5a88;
  ulong local_5a80;
  BVH *local_5a78;
  Intersectors *local_5a70;
  RayK<8> *local_5a68;
  undefined1 local_5a60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  undefined1 local_58e0 [32];
  int local_58c0;
  int iStack_58bc;
  int iStack_58b8;
  int iStack_58b4;
  int iStack_58b0;
  int iStack_58ac;
  int iStack_58a8;
  int iStack_58a4;
  uint local_58a0;
  uint uStack_589c;
  uint uStack_5898;
  uint uStack_5894;
  uint uStack_5890;
  uint uStack_588c;
  uint uStack_5888;
  uint uStack_5884;
  uint local_5880;
  uint uStack_587c;
  uint uStack_5878;
  uint uStack_5874;
  uint uStack_5870;
  uint uStack_586c;
  uint uStack_5868;
  uint uStack_5864;
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  uint local_5840;
  uint uStack_583c;
  uint uStack_5838;
  uint uStack_5834;
  uint uStack_5830;
  uint uStack_582c;
  uint uStack_5828;
  uint uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  undefined1 auVar36 [32];
  undefined1 auVar57 [32];
  
  local_5a78 = (BVH *)This->ptr;
  local_5808 = (local_5a78->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar30 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar29 = ZEXT816(0) << 0x40;
      uVar28 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar29),5);
      uVar21 = vpcmpeqd_avx512vl(auVar30,(undefined1  [32])valid_i->field_0);
      uVar28 = uVar28 & uVar21;
      bVar17 = (byte)uVar28;
      if (bVar17 != 0) {
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar58 = ZEXT3264(auVar30);
        vandps_avx512vl(local_59e0,auVar30);
        auVar31._8_4_ = 0x219392ef;
        auVar31._0_8_ = 0x219392ef219392ef;
        auVar31._12_4_ = 0x219392ef;
        auVar31._16_4_ = 0x219392ef;
        auVar31._20_4_ = 0x219392ef;
        auVar31._24_4_ = 0x219392ef;
        auVar31._28_4_ = 0x219392ef;
        uVar21 = vcmpps_avx512vl(auVar30,auVar31,1);
        bVar18 = (bool)((byte)uVar21 & 1);
        auVar32._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59e0._0_4_;
        bVar18 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar32._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59e0._4_4_;
        bVar18 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar32._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59e0._8_4_;
        bVar18 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar32._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59e0._12_4_;
        bVar18 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar32._16_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59e0._16_4_;
        bVar18 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar32._20_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59e0._20_4_;
        bVar18 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar32._24_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59e0._24_4_;
        bVar18 = SUB81(uVar21 >> 7,0);
        auVar32._28_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59e0._28_4_;
        vandps_avx512vl(local_59c0,auVar30);
        uVar21 = vcmpps_avx512vl(auVar32,auVar31,1);
        bVar18 = (bool)((byte)uVar21 & 1);
        auVar35._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59c0._0_4_;
        bVar18 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59c0._4_4_;
        bVar18 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59c0._8_4_;
        bVar18 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59c0._12_4_;
        bVar18 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59c0._16_4_;
        bVar18 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59c0._20_4_;
        bVar18 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59c0._24_4_;
        bVar18 = SUB81(uVar21 >> 7,0);
        auVar35._28_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59c0._28_4_;
        vandps_avx512vl(local_59a0,auVar30);
        uVar21 = vcmpps_avx512vl(auVar35,auVar31,1);
        bVar18 = (bool)((byte)uVar21 & 1);
        auVar30._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59a0._0_4_;
        bVar18 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar30._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59a0._4_4_;
        bVar18 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar30._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59a0._8_4_;
        bVar18 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar30._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59a0._12_4_;
        bVar18 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar30._16_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59a0._16_4_;
        bVar18 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar30._20_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59a0._20_4_;
        bVar18 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar30._24_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59a0._24_4_;
        bVar18 = SUB81(uVar21 >> 7,0);
        auVar30._28_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * local_59a0._28_4_;
        auVar33._8_4_ = 0x3f800000;
        auVar33._0_8_ = 0x3f8000003f800000;
        auVar33._12_4_ = 0x3f800000;
        auVar33._16_4_ = 0x3f800000;
        auVar33._20_4_ = 0x3f800000;
        auVar33._24_4_ = 0x3f800000;
        auVar33._28_4_ = 0x3f800000;
        auVar31 = vrcp14ps_avx512vl(auVar32);
        auVar56 = vfnmadd213ps_fma(auVar32,auVar31,auVar33);
        auVar56 = vfmadd132ps_fma(ZEXT1632(auVar56),auVar31,auVar31);
        auVar32 = vrcp14ps_avx512vl(auVar35);
        auVar12 = vfnmadd213ps_fma(auVar35,auVar32,auVar33);
        auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar32,auVar32);
        auVar32 = vrcp14ps_avx512vl(auVar30);
        auVar13 = vfnmadd213ps_fma(auVar30,auVar32,auVar33);
        local_5980 = ZEXT1632(auVar56);
        local_5960 = ZEXT1632(auVar12);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar32,auVar32);
        local_5940 = ZEXT1632(auVar13);
        local_5920 = (float)local_5a40._0_4_ * auVar56._0_4_;
        fStack_591c = (float)local_5a40._4_4_ * auVar56._4_4_;
        fStack_5918 = (float)local_5a40._8_4_ * auVar56._8_4_;
        fStack_5914 = (float)local_5a40._12_4_ * auVar56._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar12._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar12._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar12._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar12._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0._4_4_ = (float)local_5a40._68_4_ * auVar13._4_4_;
        local_58e0._0_4_ = (float)local_5a40._64_4_ * auVar13._0_4_;
        local_58e0._8_4_ = (float)local_5a40._72_4_ * auVar13._8_4_;
        local_58e0._12_4_ = (float)local_5a40._76_4_ * auVar13._12_4_;
        local_58e0._16_4_ = (float)local_5a40._80_4_ * 0.0;
        local_58e0._20_4_ = (float)local_5a40._84_4_ * 0.0;
        local_58e0._24_4_ = (float)local_5a40._88_4_ * 0.0;
        local_58e0._28_4_ = local_5a40._92_4_;
        uVar21 = vcmpps_avx512vl(ZEXT1632(auVar56),ZEXT1632(auVar29),1);
        auVar30 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        local_58c0 = (uint)((byte)uVar21 & 1) * auVar30._0_4_;
        iStack_58bc = (uint)((byte)(uVar21 >> 1) & 1) * auVar30._4_4_;
        iStack_58b8 = (uint)((byte)(uVar21 >> 2) & 1) * auVar30._8_4_;
        iStack_58b4 = (uint)((byte)(uVar21 >> 3) & 1) * auVar30._12_4_;
        iStack_58b0 = (uint)((byte)(uVar21 >> 4) & 1) * auVar30._16_4_;
        iStack_58ac = (uint)((byte)(uVar21 >> 5) & 1) * auVar30._20_4_;
        iStack_58a8 = (uint)((byte)(uVar21 >> 6) & 1) * auVar30._24_4_;
        iStack_58a4 = (uint)(byte)(uVar21 >> 7) * auVar30._28_4_;
        auVar32 = ZEXT1632(auVar29);
        uVar21 = vcmpps_avx512vl(ZEXT1632(auVar12),auVar32,5);
        auVar30 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar18 = (bool)((byte)uVar21 & 1);
        local_58a0 = (uint)bVar18 * auVar30._0_4_ | (uint)!bVar18 * 0x60;
        bVar18 = (bool)((byte)(uVar21 >> 1) & 1);
        uStack_589c = (uint)bVar18 * auVar30._4_4_ | (uint)!bVar18 * 0x60;
        bVar18 = (bool)((byte)(uVar21 >> 2) & 1);
        uStack_5898 = (uint)bVar18 * auVar30._8_4_ | (uint)!bVar18 * 0x60;
        bVar18 = (bool)((byte)(uVar21 >> 3) & 1);
        uStack_5894 = (uint)bVar18 * auVar30._12_4_ | (uint)!bVar18 * 0x60;
        bVar18 = (bool)((byte)(uVar21 >> 4) & 1);
        uStack_5890 = (uint)bVar18 * auVar30._16_4_ | (uint)!bVar18 * 0x60;
        bVar18 = (bool)((byte)(uVar21 >> 5) & 1);
        uStack_588c = (uint)bVar18 * auVar30._20_4_ | (uint)!bVar18 * 0x60;
        bVar18 = (bool)((byte)(uVar21 >> 6) & 1);
        uStack_5888 = (uint)bVar18 * auVar30._24_4_ | (uint)!bVar18 * 0x60;
        bVar18 = SUB81(uVar21 >> 7,0);
        uStack_5884 = (uint)bVar18 * auVar30._28_4_ | (uint)!bVar18 * 0x60;
        uVar21 = vcmpps_avx512vl(ZEXT1632(auVar13),auVar32,5);
        auVar30 = vpbroadcastd_avx512vl(ZEXT416(0x80));
        bVar18 = (bool)((byte)uVar21 & 1);
        local_5880 = (uint)bVar18 * auVar30._0_4_ | (uint)!bVar18 * 0xa0;
        bVar18 = (bool)((byte)(uVar21 >> 1) & 1);
        uStack_587c = (uint)bVar18 * auVar30._4_4_ | (uint)!bVar18 * 0xa0;
        bVar18 = (bool)((byte)(uVar21 >> 2) & 1);
        uStack_5878 = (uint)bVar18 * auVar30._8_4_ | (uint)!bVar18 * 0xa0;
        bVar18 = (bool)((byte)(uVar21 >> 3) & 1);
        uStack_5874 = (uint)bVar18 * auVar30._12_4_ | (uint)!bVar18 * 0xa0;
        bVar18 = (bool)((byte)(uVar21 >> 4) & 1);
        uStack_5870 = (uint)bVar18 * auVar30._16_4_ | (uint)!bVar18 * 0xa0;
        bVar18 = (bool)((byte)(uVar21 >> 5) & 1);
        uStack_586c = (uint)bVar18 * auVar30._20_4_ | (uint)!bVar18 * 0xa0;
        bVar18 = (bool)((byte)(uVar21 >> 6) & 1);
        uStack_5868 = (uint)bVar18 * auVar30._24_4_ | (uint)!bVar18 * 0xa0;
        bVar18 = SUB81(uVar21 >> 7,0);
        uStack_5864 = (uint)bVar18 * auVar30._28_4_ | (uint)!bVar18 * 0xa0;
        local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar60 = ZEXT3264(local_4680);
        auVar30 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar32);
        local_5860 = (uint)(bVar17 & 1) * auVar30._0_4_ |
                     (uint)!(bool)(bVar17 & 1) * local_4680._0_4_;
        bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
        uStack_585c = (uint)bVar18 * auVar30._4_4_ | (uint)!bVar18 * local_4680._4_4_;
        bVar18 = (bool)((byte)(uVar28 >> 2) & 1);
        uStack_5858 = (uint)bVar18 * auVar30._8_4_ | (uint)!bVar18 * local_4680._8_4_;
        bVar18 = (bool)((byte)(uVar28 >> 3) & 1);
        uStack_5854 = (uint)bVar18 * auVar30._12_4_ | (uint)!bVar18 * local_4680._12_4_;
        bVar18 = (bool)((byte)(uVar28 >> 4) & 1);
        uStack_5850 = (uint)bVar18 * auVar30._16_4_ | (uint)!bVar18 * local_4680._16_4_;
        bVar18 = (bool)((byte)(uVar28 >> 5) & 1);
        uStack_584c = (uint)bVar18 * auVar30._20_4_ | (uint)!bVar18 * local_4680._20_4_;
        bVar18 = (bool)((byte)(uVar28 >> 6) & 1);
        uStack_5848 = (uint)bVar18 * auVar30._24_4_ | (uint)!bVar18 * local_4680._24_4_;
        bVar18 = SUB81(uVar28 >> 7,0);
        uStack_5844 = (uint)bVar18 * auVar30._28_4_ | (uint)!bVar18 * local_4680._28_4_;
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar59 = ZEXT3264(auVar30);
        local_5aa4 = (undefined4)uVar28;
        auVar32 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar32);
        local_5840 = (uint)(bVar17 & 1) * auVar32._0_4_ | (uint)!(bool)(bVar17 & 1) * auVar30._0_4_;
        bVar18 = (bool)((byte)(uVar28 >> 1) & 1);
        uStack_583c = (uint)bVar18 * auVar32._4_4_ | (uint)!bVar18 * auVar30._4_4_;
        bVar18 = (bool)((byte)(uVar28 >> 2) & 1);
        uStack_5838 = (uint)bVar18 * auVar32._8_4_ | (uint)!bVar18 * auVar30._8_4_;
        bVar18 = (bool)((byte)(uVar28 >> 3) & 1);
        uStack_5834 = (uint)bVar18 * auVar32._12_4_ | (uint)!bVar18 * auVar30._12_4_;
        bVar18 = (bool)((byte)(uVar28 >> 4) & 1);
        uStack_5830 = (uint)bVar18 * auVar32._16_4_ | (uint)!bVar18 * auVar30._16_4_;
        bVar18 = (bool)((byte)(uVar28 >> 5) & 1);
        uStack_582c = (uint)bVar18 * auVar32._20_4_ | (uint)!bVar18 * auVar30._20_4_;
        bVar18 = (bool)((byte)(uVar28 >> 6) & 1);
        uStack_5828 = (uint)bVar18 * auVar32._24_4_ | (uint)!bVar18 * auVar30._24_4_;
        bVar18 = SUB81(uVar28 >> 7,0);
        uStack_5824 = (uint)bVar18 * auVar32._28_4_ | (uint)!bVar18 * auVar30._28_4_;
        local_5aac = (uint)(byte)~bVar17;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar28 = 7;
        }
        else {
          uVar28 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5a68 = ray + 0x100;
        puVar27 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar25 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5860;
        uStack_465c = uStack_585c;
        uStack_4658 = uStack_5858;
        uStack_4654 = uStack_5854;
        uStack_4650 = uStack_5850;
        uStack_464c = uStack_584c;
        uStack_4648 = uStack_5848;
        uStack_4644 = uStack_5844;
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar61 = ZEXT3264(auVar30);
        auVar29 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
        auVar62 = ZEXT1664(auVar29);
        local_5a90 = context;
        local_5aa0 = ray;
        local_5a70 = This;
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
LAB_01dd2579:
        do {
          auVar30 = auVar59._0_32_;
          auVar34._4_4_ = uStack_583c;
          auVar34._0_4_ = local_5840;
          auVar34._8_4_ = uStack_5838;
          auVar34._12_4_ = uStack_5834;
          auVar34._16_4_ = uStack_5830;
          auVar34._20_4_ = uStack_582c;
          auVar34._24_4_ = uStack_5828;
          auVar34._28_4_ = uStack_5824;
          do {
            root.ptr = puVar27[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd2ae7;
            puVar27 = puVar27 + -1;
            local_5a60 = pauVar25[-1];
            auVar54 = ZEXT3264(local_5a60);
            pauVar25 = pauVar25 + -1;
            local_5a80 = vcmpps_avx512vl(local_5a60,auVar34,1);
          } while ((char)local_5a80 == '\0');
          local_5a98 = (ulong)(uint)POPCOUNT((int)local_5a80);
          if (uVar28 < local_5a98) {
LAB_01dd25c0:
            do {
              auVar30 = auVar59._0_32_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01dd2ae7;
                auVar50._4_4_ = uStack_583c;
                auVar50._0_4_ = local_5840;
                auVar50._8_4_ = uStack_5838;
                auVar50._12_4_ = uStack_5834;
                auVar50._16_4_ = uStack_5830;
                auVar50._20_4_ = uStack_582c;
                auVar50._24_4_ = uStack_5828;
                auVar50._28_4_ = uStack_5824;
                uVar9 = vcmpps_avx512vl(auVar50,auVar54._0_32_,6);
                if ((char)uVar9 == '\0') goto LAB_01dd2579;
                bVar17 = ~(byte)local_5aac;
                auVar32 = *(undefined1 (*) [32])(local_5aa0 + 0x60);
                auVar35 = *(undefined1 (*) [32])(local_5aa0 + 0xa0);
                auVar31 = *(undefined1 (*) [32])(local_5aa0 + 0xc0);
                auVar33 = *(undefined1 (*) [32])(local_5aa0 + 0x80);
                auVar34 = *(undefined1 (*) [32])(local_5aa0 + 0x100);
                lVar26 = (root.ptr & 0xfffffffffffffff0) + 0x90;
                lVar20 = 0;
                goto LAB_01dd27ba;
              }
              uVar21 = 8;
              auVar30 = auVar60._0_32_;
              for (lVar20 = 0;
                  (auVar54 = ZEXT3264(auVar30), lVar20 != 8 &&
                  (uVar3 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar20 * 8), uVar3 != 8));
                  lVar20 = lVar20 + 1) {
                auVar46._4_4_ = fStack_591c;
                auVar46._0_4_ = local_5920;
                auVar46._8_4_ = fStack_5918;
                auVar46._12_4_ = fStack_5914;
                auVar46._16_4_ = fStack_5910;
                auVar46._20_4_ = fStack_590c;
                auVar46._24_4_ = fStack_5908;
                auVar46._28_4_ = uStack_5904;
                uVar1 = *(undefined4 *)(root.ptr + 0x40 + lVar20 * 4);
                auVar51._4_4_ = uVar1;
                auVar51._0_4_ = uVar1;
                auVar51._8_4_ = uVar1;
                auVar51._12_4_ = uVar1;
                auVar51._16_4_ = uVar1;
                auVar51._20_4_ = uVar1;
                auVar51._24_4_ = uVar1;
                auVar51._28_4_ = uVar1;
                auVar29 = vfmsub132ps_fma(auVar51,auVar46,local_5980);
                auVar47._4_4_ = fStack_58fc;
                auVar47._0_4_ = local_5900;
                auVar47._8_4_ = fStack_58f8;
                auVar47._12_4_ = fStack_58f4;
                auVar47._16_4_ = fStack_58f0;
                auVar47._20_4_ = fStack_58ec;
                auVar47._24_4_ = fStack_58e8;
                auVar47._28_4_ = uStack_58e4;
                uVar1 = *(undefined4 *)(root.ptr + 0x80 + lVar20 * 4);
                auVar52._4_4_ = uVar1;
                auVar52._0_4_ = uVar1;
                auVar52._8_4_ = uVar1;
                auVar52._12_4_ = uVar1;
                auVar52._16_4_ = uVar1;
                auVar52._20_4_ = uVar1;
                auVar52._24_4_ = uVar1;
                auVar52._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(root.ptr + 0xc0 + lVar20 * 4);
                auVar53._4_4_ = uVar1;
                auVar53._0_4_ = uVar1;
                auVar53._8_4_ = uVar1;
                auVar53._12_4_ = uVar1;
                auVar53._16_4_ = uVar1;
                auVar53._20_4_ = uVar1;
                auVar53._24_4_ = uVar1;
                auVar53._28_4_ = uVar1;
                auVar56 = vfmsub132ps_fma(auVar52,auVar47,local_5960);
                auVar12 = vfmsub132ps_fma(auVar53,local_58e0,local_5940);
                uVar1 = *(undefined4 *)(root.ptr + 0x60 + lVar20 * 4);
                auVar41._4_4_ = uVar1;
                auVar41._0_4_ = uVar1;
                auVar41._8_4_ = uVar1;
                auVar41._12_4_ = uVar1;
                auVar41._16_4_ = uVar1;
                auVar41._20_4_ = uVar1;
                auVar41._24_4_ = uVar1;
                auVar41._28_4_ = uVar1;
                auVar31 = vfmsub132ps_avx512vl(local_5980,auVar46,auVar41);
                uVar1 = *(undefined4 *)(root.ptr + 0xa0 + lVar20 * 4);
                auVar44._4_4_ = uVar1;
                auVar44._0_4_ = uVar1;
                auVar44._8_4_ = uVar1;
                auVar44._12_4_ = uVar1;
                auVar44._16_4_ = uVar1;
                auVar44._20_4_ = uVar1;
                auVar44._24_4_ = uVar1;
                auVar44._28_4_ = uVar1;
                auVar33 = vfmsub132ps_avx512vl(local_5960,auVar47,auVar44);
                uVar1 = *(undefined4 *)(root.ptr + 0xe0 + lVar20 * 4);
                auVar45._4_4_ = uVar1;
                auVar45._0_4_ = uVar1;
                auVar45._8_4_ = uVar1;
                auVar45._12_4_ = uVar1;
                auVar45._16_4_ = uVar1;
                auVar45._20_4_ = uVar1;
                auVar45._24_4_ = uVar1;
                auVar45._28_4_ = uVar1;
                auVar34 = vfmsub132ps_avx512vl(local_5940,local_58e0,auVar45);
                auVar32 = vpminsd_avx2(ZEXT1632(auVar29),auVar31);
                auVar35 = vpminsd_avx2(ZEXT1632(auVar56),auVar33);
                auVar32 = vpmaxsd_avx2(auVar32,auVar35);
                auVar35 = vpminsd_avx2(ZEXT1632(auVar12),auVar34);
                auVar32 = vpmaxsd_avx2(auVar32,auVar35);
                auVar35 = vpmaxsd_avx2(ZEXT1632(auVar29),auVar31);
                auVar31 = vpmaxsd_avx2(ZEXT1632(auVar56),auVar33);
                auVar31 = vpminsd_avx2(auVar35,auVar31);
                auVar35 = vpmaxsd_avx2(ZEXT1632(auVar12),auVar34);
                auVar31 = vpminsd_avx2(auVar31,auVar35);
                auVar48._4_4_ = uStack_585c;
                auVar48._0_4_ = local_5860;
                auVar48._8_4_ = uStack_5858;
                auVar48._12_4_ = uStack_5854;
                auVar48._16_4_ = uStack_5850;
                auVar48._20_4_ = uStack_584c;
                auVar48._24_4_ = uStack_5848;
                auVar48._28_4_ = uStack_5844;
                auVar35 = vpmaxsd_avx2(auVar32,auVar48);
                auVar14._4_4_ = uStack_583c;
                auVar14._0_4_ = local_5840;
                auVar14._8_4_ = uStack_5838;
                auVar14._12_4_ = uStack_5834;
                auVar14._16_4_ = uStack_5830;
                auVar14._20_4_ = uStack_582c;
                auVar14._24_4_ = uStack_5828;
                auVar14._28_4_ = uStack_5824;
                auVar31 = vpminsd_avx2(auVar31,auVar14);
                uVar11 = vpcmpd_avx512vl(auVar35,auVar31,2);
                uVar16 = uVar21;
                auVar36 = auVar30;
                if ((byte)uVar11 != 0) {
                  auVar35 = vblendmps_avx512vl(auVar60._0_32_,auVar32);
                  bVar18 = (bool)((byte)uVar11 & 1);
                  auVar36._0_4_ = (uint)bVar18 * auVar35._0_4_ | (uint)!bVar18 * auVar32._0_4_;
                  bVar18 = (bool)((byte)(uVar11 >> 1) & 1);
                  auVar36._4_4_ = (uint)bVar18 * auVar35._4_4_ | (uint)!bVar18 * auVar32._4_4_;
                  bVar18 = (bool)((byte)(uVar11 >> 2) & 1);
                  auVar36._8_4_ = (uint)bVar18 * auVar35._8_4_ | (uint)!bVar18 * auVar32._8_4_;
                  bVar18 = (bool)((byte)(uVar11 >> 3) & 1);
                  auVar36._12_4_ = (uint)bVar18 * auVar35._12_4_ | (uint)!bVar18 * auVar32._12_4_;
                  bVar18 = (bool)((byte)(uVar11 >> 4) & 1);
                  auVar36._16_4_ = (uint)bVar18 * auVar35._16_4_ | (uint)!bVar18 * auVar32._16_4_;
                  bVar18 = (bool)((byte)(uVar11 >> 5) & 1);
                  auVar36._20_4_ = (uint)bVar18 * auVar35._20_4_ | (uint)!bVar18 * auVar32._20_4_;
                  bVar18 = (bool)((byte)(uVar11 >> 6) & 1);
                  auVar36._24_4_ = (uint)bVar18 * auVar35._24_4_ | (uint)!bVar18 * auVar32._24_4_;
                  bVar18 = SUB81(uVar11 >> 7,0);
                  auVar36._28_4_ = (uint)bVar18 * auVar35._28_4_ | (uint)!bVar18 * auVar32._28_4_;
                  uVar16 = uVar3;
                  if (uVar21 != 8) {
                    *puVar27 = uVar21;
                    puVar27 = puVar27 + 1;
                    *pauVar25 = auVar30;
                    pauVar25 = pauVar25 + 1;
                  }
                }
                auVar30 = auVar36;
                uVar21 = uVar16;
              }
              if (uVar21 == 8) goto LAB_01dd2728;
              auVar15._4_4_ = uStack_583c;
              auVar15._0_4_ = local_5840;
              auVar15._8_4_ = uStack_5838;
              auVar15._12_4_ = uStack_5834;
              auVar15._16_4_ = uStack_5830;
              auVar15._20_4_ = uStack_582c;
              auVar15._24_4_ = uStack_5828;
              auVar15._28_4_ = uStack_5824;
              uVar9 = vcmpps_avx512vl(auVar30,auVar15,9);
              root.ptr = uVar21;
            } while ((byte)uVar28 < (byte)POPCOUNT((int)uVar9));
            *puVar27 = uVar21;
            puVar27 = puVar27 + 1;
            *pauVar25 = auVar30;
            pauVar25 = pauVar25 + 1;
LAB_01dd2728:
            iVar19 = 4;
          }
          else {
            while (bVar17 = (byte)local_5aac, local_5a80 != 0) {
              local_5a88 = 0;
              for (uVar21 = local_5a80; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000
                  ) {
                local_5a88 = local_5a88 + 1;
              }
              local_5a80 = local_5a80 - 1 & local_5a80;
              bVar18 = occluded1(local_5a70,local_5a78,root,local_5a88,&local_5aa5,local_5aa0,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,local_5a90);
              bVar22 = (byte)(1 << ((uint)local_5a88 & 0x1f));
              if (!bVar18) {
                bVar22 = 0;
              }
              local_5aac = (uint)(bVar17 | bVar22);
            }
            iVar19 = 3;
            auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar58 = ZEXT3264(auVar30);
            auVar30 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar59 = ZEXT3264(auVar30);
            auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar60 = ZEXT3264(auVar30);
            auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar61 = ZEXT3264(auVar30);
            auVar29 = vxorps_avx512vl(auVar62._0_16_,auVar62._0_16_);
            auVar62 = ZEXT1664(auVar29);
            auVar54 = ZEXT3264(local_5a60);
            if (bVar17 != 0xff) {
              auVar30 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_5840 = (uint)(bVar17 & 1) * auVar30._0_4_ | !(bool)(bVar17 & 1) * local_5840;
              bVar18 = (bool)((byte)(local_5aac >> 1) & 1);
              uStack_583c = (uint)bVar18 * auVar30._4_4_ | !bVar18 * uStack_583c;
              bVar18 = (bool)((byte)(local_5aac >> 2) & 1);
              uStack_5838 = (uint)bVar18 * auVar30._8_4_ | !bVar18 * uStack_5838;
              bVar18 = (bool)((byte)(local_5aac >> 3) & 1);
              uStack_5834 = (uint)bVar18 * auVar30._12_4_ | !bVar18 * uStack_5834;
              bVar18 = (bool)((byte)(local_5aac >> 4) & 1);
              uStack_5830 = (uint)bVar18 * auVar30._16_4_ | !bVar18 * uStack_5830;
              bVar18 = (bool)((byte)(local_5aac >> 5) & 1);
              uStack_582c = (uint)bVar18 * auVar30._20_4_ | !bVar18 * uStack_582c;
              bVar18 = (bool)((byte)(local_5aac >> 6) & 1);
              uStack_5828 = (uint)bVar18 * auVar30._24_4_ | !bVar18 * uStack_5828;
              uStack_5824 = (local_5aac >> 7) * auVar30._28_4_ |
                            !SUB41(local_5aac >> 7,0) * uStack_5824;
              iVar19 = 2;
            }
            if ((uint)uVar28 < (uint)local_5a98) goto LAB_01dd25c0;
          }
          auVar30 = auVar59._0_32_;
        } while (iVar19 != 3);
LAB_01dd2ae7:
        local_5aac._0_1_ = (byte)local_5aac & (byte)local_5aa4;
        bVar18 = (bool)((byte)local_5aac >> 1 & 1);
        bVar4 = (bool)((byte)local_5aac >> 2 & 1);
        bVar5 = (bool)((byte)local_5aac >> 3 & 1);
        bVar6 = (bool)((byte)local_5aac >> 4 & 1);
        bVar7 = (bool)((byte)local_5aac >> 5 & 1);
        bVar8 = (bool)((byte)local_5aac >> 6 & 1);
        *(uint *)local_5a68 =
             (uint)((byte)local_5aac & 1) * auVar30._0_4_ |
             (uint)!(bool)((byte)local_5aac & 1) * *(int *)local_5a68;
        *(uint *)(local_5a68 + 4) =
             (uint)bVar18 * auVar30._4_4_ | (uint)!bVar18 * *(int *)(local_5a68 + 4);
        *(uint *)(local_5a68 + 8) =
             (uint)bVar4 * auVar30._8_4_ | (uint)!bVar4 * *(int *)(local_5a68 + 8);
        *(uint *)(local_5a68 + 0xc) =
             (uint)bVar5 * auVar30._12_4_ | (uint)!bVar5 * *(int *)(local_5a68 + 0xc);
        *(uint *)(local_5a68 + 0x10) =
             (uint)bVar6 * auVar30._16_4_ | (uint)!bVar6 * *(int *)(local_5a68 + 0x10);
        *(uint *)(local_5a68 + 0x14) =
             (uint)bVar7 * auVar30._20_4_ | (uint)!bVar7 * *(int *)(local_5a68 + 0x14);
        *(uint *)(local_5a68 + 0x18) =
             (uint)bVar8 * auVar30._24_4_ | (uint)!bVar8 * *(int *)(local_5a68 + 0x18);
        *(uint *)(local_5a68 + 0x1c) =
             (uint)((byte)local_5aac >> 7) * auVar30._28_4_ |
             (uint)!(bool)((byte)local_5aac >> 7) * *(int *)(local_5a68 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_01dd27ba:
  do {
    if (lVar20 == (ulong)((uint)root.ptr & 0xf) - 8) goto LAB_01dd29b9;
    lVar23 = -0x10;
    bVar22 = bVar17;
    do {
      if ((lVar23 == 0) || (uVar21 = (ulong)*(uint *)(lVar26 + 0x10 + lVar23), uVar21 == 0xffffffff)
         ) goto LAB_01dd29a4;
      uVar1 = *(undefined4 *)(lVar26 + -0x80 + lVar23);
      auVar55._4_4_ = uVar1;
      auVar55._0_4_ = uVar1;
      auVar55._8_4_ = uVar1;
      auVar55._12_4_ = uVar1;
      auVar55._16_4_ = uVar1;
      auVar55._20_4_ = uVar1;
      auVar55._24_4_ = uVar1;
      auVar55._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar26 + -0x70 + lVar23);
      auVar49._4_4_ = uVar1;
      auVar49._0_4_ = uVar1;
      auVar49._8_4_ = uVar1;
      auVar49._12_4_ = uVar1;
      auVar49._16_4_ = uVar1;
      auVar49._20_4_ = uVar1;
      auVar49._24_4_ = uVar1;
      auVar49._28_4_ = uVar1;
      auVar50 = vsubps_avx(auVar55,*(undefined1 (*) [32])local_5aa0);
      auVar55 = vsubps_avx(auVar49,*(undefined1 (*) [32])(local_5aa0 + 0x20));
      uVar1 = *(undefined4 *)(lVar26 + -0x60 + lVar23);
      auVar40._4_4_ = uVar1;
      auVar40._0_4_ = uVar1;
      auVar40._8_4_ = uVar1;
      auVar40._12_4_ = uVar1;
      auVar40._16_4_ = uVar1;
      auVar40._20_4_ = uVar1;
      auVar40._24_4_ = uVar1;
      auVar40._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar26 + -0x50 + lVar23);
      auVar56._4_4_ = uVar1;
      auVar56._0_4_ = uVar1;
      auVar56._8_4_ = uVar1;
      auVar56._12_4_ = uVar1;
      auVar57._16_4_ = uVar1;
      auVar57._0_16_ = auVar56;
      auVar57._20_4_ = uVar1;
      auVar57._24_4_ = uVar1;
      auVar57._28_4_ = uVar1;
      auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar26 + -0x40 + lVar23)));
      auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar26 + -0x30 + lVar23)));
      auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar26 + -0x20 + lVar23)));
      auVar49 = vsubps_avx(auVar40,*(undefined1 (*) [32])(local_5aa0 + 0x40));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar26 + -0x10 + lVar23)));
      auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar26 + lVar23)));
      auVar29 = vmulss_avx512f(auVar37._0_16_,auVar41._0_16_);
      auVar42._0_4_ = auVar29._0_4_;
      auVar42._4_4_ = auVar42._0_4_;
      auVar42._8_4_ = auVar42._0_4_;
      auVar42._12_4_ = auVar42._0_4_;
      auVar42._16_4_ = auVar42._0_4_;
      auVar42._20_4_ = auVar42._0_4_;
      auVar42._24_4_ = auVar42._0_4_;
      auVar42._28_4_ = auVar42._0_4_;
      auVar42 = vfmsub231ps_avx512vl(auVar42,auVar40,auVar38);
      auVar29 = vmulss_avx512f(auVar38._0_16_,auVar39._0_16_);
      auVar43._0_4_ = auVar29._0_4_;
      auVar43._4_4_ = auVar43._0_4_;
      auVar43._8_4_ = auVar43._0_4_;
      auVar43._12_4_ = auVar43._0_4_;
      auVar43._16_4_ = auVar43._0_4_;
      auVar43._20_4_ = auVar43._0_4_;
      auVar43._24_4_ = auVar43._0_4_;
      auVar43._28_4_ = auVar43._0_4_;
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar41,auVar57);
      auVar29 = vmulss_avx512f(auVar56,auVar40._0_16_);
      auVar44 = vbroadcastss_avx512vl(auVar29);
      auVar44 = vfmsub231ps_avx512vl(auVar44,auVar39,auVar37);
      auVar45 = vmulps_avx512vl(auVar35,auVar49);
      auVar45 = vfmsub231ps_avx512vl(auVar45,auVar55,auVar31);
      auVar46 = vmulps_avx512vl(auVar31,auVar50);
      auVar46 = vfmsub231ps_avx512vl(auVar46,auVar49,auVar33);
      auVar47 = vmulps_avx512vl(auVar33,auVar55);
      auVar47 = vfmsub231ps_avx512vl(auVar47,auVar50,auVar35);
      auVar48 = vmulps_avx512vl(auVar44,auVar31);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar43,auVar35);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar42,auVar33);
      vandps_avx512vl(auVar48,auVar61._0_32_);
      auVar41 = vmulps_avx512vl(auVar41,auVar47);
      auVar40 = vfmadd231ps_avx512vl(auVar41,auVar46,auVar40);
      auVar39 = vfmadd231ps_avx512vl(auVar40,auVar45,auVar39);
      auVar39 = vxorps_avx512vl(auVar48,auVar39);
      uVar9 = vcmpps_avx512vl(auVar39,auVar62._0_32_,5);
      bVar24 = (byte)uVar9 & bVar22;
      if (bVar24 == 0) {
LAB_01dd28cd:
        bVar24 = 0;
      }
      else {
        auVar38 = vmulps_avx512vl(auVar38,auVar47);
        auVar37 = vfmadd213ps_avx512vl(auVar46,auVar37,auVar38);
        auVar37 = vfmadd213ps_avx512vl(auVar45,auVar57,auVar37);
        auVar37 = vxorps_avx512vl(auVar48,auVar37);
        uVar9 = vcmpps_avx512vl(auVar37,auVar62._0_32_,5);
        bVar24 = bVar24 & (byte)uVar9;
        if (bVar24 == 0) goto LAB_01dd28cd;
        vandps_avx512vl(auVar48,auVar58._0_32_);
        auVar38 = vsubps_avx512vl(auVar37,auVar39);
        uVar9 = vcmpps_avx512vl(auVar38,auVar37,5);
        bVar24 = bVar24 & (byte)uVar9;
        if (bVar24 == 0) goto LAB_01dd28cd;
        auVar49 = vmulps_avx512vl(auVar44,auVar49);
        auVar29 = vfmadd213ps_fma(auVar55,auVar43,auVar49);
        auVar29 = vfmadd213ps_fma(auVar50,auVar42,ZEXT1632(auVar29));
        auVar50 = vxorps_avx512vl(auVar48,ZEXT1632(auVar29));
        auVar39._0_4_ = auVar37._0_4_ * auVar32._0_4_;
        auVar39._4_4_ = auVar37._4_4_ * auVar32._4_4_;
        auVar39._8_4_ = auVar37._8_4_ * auVar32._8_4_;
        auVar39._12_4_ = auVar37._12_4_ * auVar32._12_4_;
        auVar39._16_4_ = auVar37._16_4_ * auVar32._16_4_;
        auVar39._20_4_ = auVar37._20_4_ * auVar32._20_4_;
        auVar39._24_4_ = auVar37._24_4_ * auVar32._24_4_;
        auVar39._28_4_ = 0;
        auVar38._4_4_ = auVar37._4_4_ * auVar34._4_4_;
        auVar38._0_4_ = auVar37._0_4_ * auVar34._0_4_;
        auVar38._8_4_ = auVar37._8_4_ * auVar34._8_4_;
        auVar38._12_4_ = auVar37._12_4_ * auVar34._12_4_;
        auVar38._16_4_ = auVar37._16_4_ * auVar34._16_4_;
        auVar38._20_4_ = auVar37._20_4_ * auVar34._20_4_;
        auVar38._24_4_ = auVar37._24_4_ * auVar34._24_4_;
        auVar38._28_4_ = auVar49._28_4_;
        uVar9 = vcmpps_avx512vl(auVar50,auVar38,2);
        uVar10 = vcmpps_avx512vl(auVar39,auVar50,1);
        bVar24 = bVar24 & (byte)uVar9 & (byte)uVar10;
        auVar29 = auVar62._0_16_;
        if (bVar24 == 0) {
          bVar24 = 0;
          auVar29 = vxorps_avx512vl(auVar29,auVar29);
          auVar62 = ZEXT1664(auVar29);
        }
        else {
          auVar29 = vxorps_avx512vl(auVar29,auVar29);
          auVar62 = ZEXT1664(auVar29);
          uVar9 = vcmpps_avx512vl(auVar48,ZEXT1632(auVar29),4);
          bVar24 = bVar24 & (byte)uVar9;
        }
      }
      uVar2 = ((local_5a90->scene->geometries).items[uVar21].ptr)->mask;
      auVar37._4_4_ = uVar2;
      auVar37._0_4_ = uVar2;
      auVar37._8_4_ = uVar2;
      auVar37._12_4_ = uVar2;
      auVar37._16_4_ = uVar2;
      auVar37._20_4_ = uVar2;
      auVar37._24_4_ = uVar2;
      auVar37._28_4_ = uVar2;
      uVar9 = vptestmd_avx512vl(*(undefined1 (*) [32])(local_5aa0 + 0x120),auVar37);
      lVar23 = lVar23 + 4;
      bVar22 = bVar22 & ~((byte)uVar9 & bVar24);
    } while (bVar22 != 0);
    bVar22 = 0;
LAB_01dd29a4:
    lVar20 = lVar20 + 1;
    lVar26 = lVar26 + 0xb0;
    bVar17 = bVar17 & bVar22;
  } while (bVar17 != 0);
  bVar17 = 0;
LAB_01dd29b9:
  bVar17 = (byte)local_5aac | ~bVar17;
  local_5aac = (uint)bVar17;
  if (bVar17 == 0xff) {
    local_5aac._0_1_ = 0xff;
    goto LAB_01dd2ae7;
  }
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_5840 = (uint)(bVar17 & 1) * auVar30._0_4_ | !(bool)(bVar17 & 1) * local_5840;
  bVar18 = (bool)(bVar17 >> 1 & 1);
  uStack_583c = (uint)bVar18 * auVar30._4_4_ | !bVar18 * uStack_583c;
  bVar18 = (bool)(bVar17 >> 2 & 1);
  uStack_5838 = (uint)bVar18 * auVar30._8_4_ | !bVar18 * uStack_5838;
  bVar18 = (bool)(bVar17 >> 3 & 1);
  uStack_5834 = (uint)bVar18 * auVar30._12_4_ | !bVar18 * uStack_5834;
  bVar18 = (bool)(bVar17 >> 4 & 1);
  uStack_5830 = (uint)bVar18 * auVar30._16_4_ | !bVar18 * uStack_5830;
  bVar18 = (bool)(bVar17 >> 5 & 1);
  uStack_582c = (uint)bVar18 * auVar30._20_4_ | !bVar18 * uStack_582c;
  bVar18 = (bool)(bVar17 >> 6 & 1);
  uStack_5828 = (uint)bVar18 * auVar30._24_4_ | !bVar18 * uStack_5828;
  uStack_5824 = (uint)(bVar17 >> 7) * auVar30._28_4_ | !(bool)(bVar17 >> 7) * uStack_5824;
  goto LAB_01dd2579;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }